

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drumtab.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t __n;
  void *__buf;
  allocator local_329;
  string local_328 [32];
  int local_308 [2];
  int bsdata [50];
  int local_238 [2];
  int sndata [50];
  int local_168 [2];
  int hhdata [50];
  undefined1 local_88 [8];
  MidiFile outputfile;
  char **argv_local;
  int argc_local;
  
  outputfile._104_8_ = argv;
  smf::MidiFile::MidiFile((MidiFile *)local_88);
  smf::MidiFile::absoluteTicks((MidiFile *)local_88);
  smf::MidiFile::setTicksPerQuarterNote((MidiFile *)local_88,0x78);
  memcpy(local_168,&DAT_0013a010,200);
  memcpy(local_238,&DAT_0013a0e0,200);
  memcpy(local_308,&DAT_0013a1b0,200);
  AddDrumTrack((MidiFile *)local_88,local_168,0x3b,0x1e);
  AddDrumTrack((MidiFile *)local_88,local_238,0x26,0x1e);
  __n = 0x1e;
  AddDrumTrack((MidiFile *)local_88,local_308,0x29,0x1e);
  smf::MidiFile::sortTracks((MidiFile *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"rhythm.mid",&local_329);
  smf::MidiFile::write((MidiFile *)local_88,(int)local_328,__buf,__n);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  smf::MidiFile::~MidiFile((MidiFile *)local_88);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile outputfile;        // create an empty MIDI file with one track
   outputfile.absoluteTicks(); // time information stored as absolute time
                               // (will be coverted to delta time when written)
   outputfile.setTicksPerQuarterNote(QUARTER);

   int hhdata[50] = {'x', '-', 'x', '-', 'x', '-', 'x', '-', -1};
   int sndata[50] = {'-', '-', 'x', '-', '-', '-', 'x', '-', -1};
   int bsdata[50] = {'x', '-', '-', '-', 'x', '-', '-', '-', -1};

   AddDrumTrack(outputfile, hhdata, HIGH_HAT,  SIXTEENTH);
   AddDrumTrack(outputfile, sndata, SNARE,     SIXTEENTH);
   AddDrumTrack(outputfile, bsdata, BASS_DRUM, SIXTEENTH);

   outputfile.sortTracks();         // make sure data is in correct order
   outputfile.write("rhythm.mid");  // write Standard MIDI File twinkle.mid

   return 0;
}